

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O3

void __thiscall FConsoleBuffer::FormatText(FConsoleBuffer *this,FFont *formatfont,int displaywidth)

{
  uint *puVar1;
  TArray<unsigned_int,_unsigned_int> *this_00;
  FBrokenLines *pFVar2;
  int iVar3;
  FBrokenLines *pFVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  if (((this->mLastFont != formatfont) || (this->mLastDisplayWidth != displaywidth)) ||
     (this->mBufferWasCleared == true)) {
    FreeBrokenText(this,0,0x7fffffff);
    if ((this->mBrokenConsoleText).Count != 0) {
      (this->mBrokenConsoleText).Count = 0;
    }
    if ((this->mBrokenStart).Count != 0) {
      (this->mBrokenStart).Count = 0;
    }
    TArray<unsigned_int,_unsigned_int>::Grow(&this->mBrokenStart,1);
    (this->mBrokenStart).Array[(this->mBrokenStart).Count] = 0;
    puVar1 = &(this->mBrokenStart).Count;
    *puVar1 = *puVar1 + 1;
    if ((this->mBrokenLines).Count != 0) {
      (this->mBrokenLines).Count = 0;
    }
    this->mLastFont = formatfont;
    this->mLastDisplayWidth = displaywidth;
    this->mBufferWasCleared = false;
  }
  uVar7 = (this->mBrokenConsoleText).Count;
  uVar6 = (ulong)uVar7;
  if ((uVar7 == (this->mConsoleText).Count) && (this->mLastLineNeedsUpdate == true)) {
    uVar7 = uVar7 - 1;
    uVar6 = (ulong)uVar7;
    V_FreeBrokenLines((this->mBrokenConsoleText).Array[uVar6]);
    puVar1 = &(this->mBrokenConsoleText).Count;
    uVar5 = uVar7 - *puVar1;
    if (*puVar1 <= uVar7 && uVar5 != 0) {
      TArray<FBrokenLines_*,_FBrokenLines_*>::Grow(&this->mBrokenConsoleText,uVar5);
    }
    (this->mBrokenConsoleText).Count = uVar7;
  }
  uVar8 = (uint)uVar6;
  uVar7 = (this->mBrokenStart).Array[uVar6];
  puVar1 = &(this->mBrokenLines).Count;
  uVar5 = uVar7 - *puVar1;
  if (*puVar1 <= uVar7 && uVar5 != 0) {
    TArray<FBrokenLines_*,_FBrokenLines_*>::Grow(&this->mBrokenLines,uVar5);
  }
  this_00 = &this->mBrokenStart;
  (this->mBrokenLines).Count = uVar7;
  puVar1 = &(this->mBrokenStart).Count;
  uVar7 = uVar8 - *puVar1;
  if (*puVar1 <= uVar8 && uVar7 != 0) {
    TArray<unsigned_int,_unsigned_int>::Grow(this_00,uVar7);
  }
  (this->mBrokenStart).Count = uVar8;
  if (uVar8 < (this->mConsoleText).Count) {
    do {
      pFVar4 = V_BreakLines(formatfont,displaywidth,(BYTE *)(this->mConsoleText).Array[uVar6].Chars,
                            true);
      TArray<FBrokenLines_*,_FBrokenLines_*>::Grow(&this->mBrokenConsoleText,1);
      uVar7 = (this->mBrokenConsoleText).Count;
      (this->mBrokenConsoleText).Array[uVar7] = pFVar4;
      (this->mBrokenConsoleText).Count = uVar7 + 1;
      uVar7 = (this->mBrokenLines).Count;
      TArray<unsigned_int,_unsigned_int>::Grow(this_00,1);
      (this->mBrokenStart).Array[(this->mBrokenStart).Count] = uVar7;
      puVar1 = &(this->mBrokenStart).Count;
      *puVar1 = *puVar1 + 1;
      iVar3 = pFVar4->Width;
      while (iVar3 != -1) {
        TArray<FBrokenLines_*,_FBrokenLines_*>::Grow(&this->mBrokenLines,1);
        uVar7 = (this->mBrokenLines).Count;
        (this->mBrokenLines).Array[uVar7] = pFVar4;
        (this->mBrokenLines).Count = uVar7 + 1;
        pFVar2 = pFVar4 + 1;
        pFVar4 = pFVar4 + 1;
        iVar3 = pFVar2->Width;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->mConsoleText).Count);
  }
  uVar7 = (this->mBrokenLines).Count;
  this->mTextLines = uVar7;
  TArray<unsigned_int,_unsigned_int>::Grow(this_00,1);
  (this->mBrokenStart).Array[(this->mBrokenStart).Count] = uVar7;
  puVar1 = &(this->mBrokenStart).Count;
  *puVar1 = *puVar1 + 1;
  this->mLastLineNeedsUpdate = false;
  return;
}

Assistant:

void FConsoleBuffer::FormatText(FFont *formatfont, int displaywidth)
{
	if (formatfont != mLastFont || displaywidth != mLastDisplayWidth || mBufferWasCleared)
	{
		FreeBrokenText();
		mBrokenConsoleText.Clear();
		mBrokenStart.Clear();
		mBrokenStart.Push(0);
		mBrokenLines.Clear();
		mLastFont = formatfont;
		mLastDisplayWidth = displaywidth;
		mBufferWasCleared = false;
	}
	unsigned brokensize = mBrokenConsoleText.Size();
	if (brokensize == mConsoleText.Size())
	{
		// The last line got text appended. We have to wait until here to format it because
		// it is possible that during display new text will be added from the NetUpdate calls in the software version of DrawTextureV.
		if (mLastLineNeedsUpdate)
		{
			brokensize--;
			V_FreeBrokenLines(mBrokenConsoleText[brokensize]);
			mBrokenConsoleText.Resize(brokensize);
		}
	}
	mBrokenLines.Resize(mBrokenStart[brokensize]);
	mBrokenStart.Resize(brokensize);
	for (unsigned i = brokensize; i < mConsoleText.Size(); i++)
	{
		FBrokenLines *bl = V_BreakLines(formatfont, displaywidth, mConsoleText[i], true);
		mBrokenConsoleText.Push(bl);
		mBrokenStart.Push(mBrokenLines.Size());
		while (bl->Width != -1)
		{
			mBrokenLines.Push(bl);
			bl++;
		}
	}
	mTextLines = mBrokenLines.Size();
	mBrokenStart.Push(mTextLines);
	mLastLineNeedsUpdate = false;
}